

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O0

void amrex::write_to_stderr_without_buffering(char *str)

{
  int iVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  char *in_RDI;
  char *end;
  char *cprocall;
  __string_type tmp;
  ostringstream procall;
  string local_1b0 [48];
  ostringstream local_180 [376];
  char *local_8;
  
  local_8 = in_RDI;
  fflush((FILE *)0x0);
  if (local_8 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    iVar1 = ParallelDescriptor::MyProc();
    poVar2 = (ostream *)std::ostream::operator<<(local_180,iVar1);
    std::operator<<(poVar2,"::");
    std::__cxx11::ostringstream::str();
    __s = (char *)std::__cxx11::string::c_str();
    sVar3 = strlen(__s);
    fwrite(__s,sVar3,1,_stderr);
    sVar3 = strlen(local_8);
    fwrite(local_8,sVar3,1,_stderr);
    fwrite(" !!!\n",5,1,_stderr);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::ostringstream::~ostringstream(local_180);
  }
  return;
}

Assistant:

void
amrex::write_to_stderr_without_buffering (const char* str)
{
    //
    // Flush all buffers.
    //
    fflush(NULL);

    if (str)
    {
        std::ostringstream procall;
        procall << ParallelDescriptor::MyProc() << "::";
        auto tmp = procall.str();
        const char *cprocall = tmp.c_str();
        const char * const end = " !!!\n";
        fwrite(cprocall, strlen(cprocall), 1, stderr);
        fwrite(str, strlen(str), 1, stderr);
        fwrite(end, strlen(end), 1, stderr);
    }
}